

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.cpp
# Opt level: O3

char * __thiscall cplus::lang::StringSet::getStruction(StringSet *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *pcVar2;
  size_t id;
  CPlusString swap;
  undefined8 local_98;
  StringBuilder local_90;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  
  paVar1 = &local_90.value.field_2;
  local_90.value.field_2._M_allocated_capacity = 0;
  local_90.value.field_2._8_8_ = 0;
  local_90.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124620;
  local_90.value._M_string_length = 0;
  local_98 = 0;
  local_90.value._M_dataplus._M_p = (pointer)paVar1;
  utils::StringBuilder::append(&local_90,"[");
  local_50 = std::
             _Function_handler<void_(cplus::lang::StringSet::TreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tursom[P]cplus/cplus/lang/String.cpp:154:19)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(cplus::lang::StringSet::TreeNode_*),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/tursom[P]cplus/cplus/lang/String.cpp:154:19)>
             ::_M_manager;
  local_68._M_unused._M_object = &local_90;
  local_68._8_8_ = &local_98;
  TreeNode::forEach(this->root,(function<void_(cplus::lang::StringSet::TreeNode_*)> *)&local_68);
  if (local_58 != (code *)0x0) {
    (*local_58)(&local_68,&local_68,__destroy_functor);
  }
  utils::StringBuilder::append(&local_90,"]");
  pcVar2 = utils::StringBuilder::c_str(&local_90);
  CPlusString::CPlusString((CPlusString *)&local_68,pcVar2);
  struction = CPlusString::getStr((CPlusString *)&local_68);
  CPlusString::setToNull((CPlusString *)&local_68);
  pcVar2 = struction;
  CPlusString::~CPlusString((CPlusString *)&local_68);
  local_90.super_Object._vptr_Object = (_func_int **)&PTR_toString_00124620;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90.value._M_dataplus._M_p != paVar1) {
    operator_delete(local_90.value._M_dataplus._M_p);
  }
  return pcVar2;
}

Assistant:

char *getStruction() const {
				utils::StringBuilder sb = utils::StringBuilder();
				size_t id = 0;
				sb.append("[");
				root->forEach([&sb, &id](TreeNode *it) {
					if (id != 0) {
						sb.append(",");
					}
					sb.append(R"({"node":")");
					sb.append((void *) it);
					sb.append(R"(","parent":")");
					sb.append((void *) it->getParent());
					sb.append(R"(","left":")");
					sb.append((void *) it->getLeft());
					sb.append(R"(","right":")");
					sb.append((void *) it->getRight());
					sb.append(R"(","color":")");
					sb.append(it->isRed() ? "RED" : "BLACK");
					sb.append(R"(","size":")");
					sb.append((unsigned long) it->getSize());
					sb.append(R"(","leftOrRight":")");
					sb.append(it->isLeftNode() ? "LEFT" : "RIGHT");
					sb.append(R"(","value":")");
					
					auto strSize = it->get()->getSize();
					auto *buffer = new char[strSize * 2];
					escapeString(buffer, it->get()->getStr(), strSize);
					sb.append(buffer);
					delete[] buffer;
					
					sb.append("\"}");
					++id;
				});
				sb.append("]");
				auto swap = CPlusString(sb.c_str());
				struction = swap.getStr();
				swap.setToNull();
				return struction;
			}